

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

uint32 add_ctab_typeinfo(Context_conflict2 *ctx,MOJOSHADER_symbolTypeInfo *info)

{
  MOJOSHADER_symbolStructMember *pMVar1;
  uint8 *bytes_00;
  uint32 uVar2;
  uint8 *bytes_01;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  uint8 bytes [16];
  undefined8 local_58;
  undefined2 local_50;
  undefined2 local_4e;
  uint32 local_4c;
  ulong local_40;
  uint8 *local_38;
  
  auVar7._0_4_ = info->parameter_class;
  auVar7._4_4_ = info->parameter_type;
  auVar7._8_4_ = info->rows;
  auVar7._12_4_ = info->columns;
  auVar7 = pshuflw(auVar7,auVar7,0xe8);
  auVar7 = pshufhw(auVar7,auVar7,0xe8);
  local_58 = CONCAT44(auVar7._8_4_,auVar7._0_4_);
  local_50 = (undefined2)info->elements;
  local_4e = (undefined2)info->member_count;
  uVar4 = info->member_count << 3;
  bytes_01 = (uint8 *)(*ctx->malloc)(uVar4,ctx->malloc_data);
  if (bytes_01 == (uint8 *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    uVar2 = 0;
  }
  else {
    local_40 = (ulong)uVar4;
    if (info->member_count != 0) {
      lVar6 = 8;
      uVar5 = 0;
      local_38 = bytes_01;
      do {
        pMVar1 = info->members;
        bytes_00 = *(uint8 **)((long)pMVar1 + lVar6 + -8);
        sVar3 = strlen((char *)bytes_00);
        bytes_01 = local_38;
        uVar2 = add_ctab_bytes(ctx,bytes_00,sVar3 + 1);
        *(uint32 *)(bytes_01 + uVar5 * 8) = uVar2;
        uVar2 = add_ctab_typeinfo(ctx,(MOJOSHADER_symbolTypeInfo *)((long)&pMVar1->name + lVar6));
        *(uint32 *)(bytes_01 + uVar5 * 8 + 4) = uVar2;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x28;
      } while (uVar5 < info->member_count);
    }
    uVar2 = add_ctab_bytes(ctx,bytes_01,local_40);
    (*ctx->free)(bytes_01,ctx->malloc_data);
  }
  local_4c = uVar2;
  uVar2 = add_ctab_bytes(ctx,(uint8 *)&local_58,0x10);
  return uVar2;
}

Assistant:

static uint32 add_ctab_typeinfo(Context *ctx, const MOJOSHADER_symbolTypeInfo *info)
{
    uint8 bytes[CTYPEINFO_SIZE];
    union { uint8 *ui8; uint16 *ui16; uint32 *ui32; } ptr;
    ptr.ui8 = bytes;

    *(ptr.ui16++) = SWAP16((uint16) info->parameter_class);
    *(ptr.ui16++) = SWAP16((uint16) info->parameter_type);
    *(ptr.ui16++) = SWAP16((uint16) info->rows);
    *(ptr.ui16++) = SWAP16((uint16) info->columns);
    *(ptr.ui16++) = SWAP16((uint16) info->elements);
    *(ptr.ui16++) = SWAP16((uint16) info->member_count);
    *(ptr.ui32++) = SWAP32(add_ctab_members(ctx, info));

    return add_ctab_bytes(ctx, bytes, sizeof (bytes));
}